

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall
Fossilize::ZipDatabase::ZipDatabase(ZipDatabase *this,string *path_,DatabaseMode mode_)

{
  pointer pcVar1;
  __node_base_ptr *pp_Var2;
  long lVar3;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_004c1828
  ;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (path_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar1,pcVar1 + path_->_M_string_length);
  pp_Var2 = &this->seen_blobs[0]._M_h._M_single_bucket;
  lVar3 = 0x230;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  this->mode = mode_;
  this->alive = false;
  if (mode_ == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  mz_zip_zero_struct(&this->mz);
  return;
}

Assistant:

ZipDatabase(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
		mz_zip_zero_struct(&mz);
	}